

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O3

bool __thiscall FpgaIO::WriteFirewirePhy(FpgaIO *this,uchar addr,uchar data)

{
  BasePort *pBVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  ostream *poVar3;
  
  if (0xf < addr) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"WriteFirewirePhy: invalid addr ",0x1f);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    return false;
  }
  pBVar1 = (this->super_BoardIO).port;
  UNRECOVERED_JUMPTABLE = pBVar1->_vptr_BasePort[0x24];
  iVar2 = (*UNRECOVERED_JUMPTABLE)
                    (pBVar1,(ulong)(this->super_BoardIO).BoardId,1,
                     (ulong)((uint)data + (uint)addr * 0x100 + 0x1000),UNRECOVERED_JUMPTABLE);
  return SUB41(iVar2,0);
}

Assistant:

bool FpgaIO::WriteFirewirePhy(unsigned char addr, unsigned char data)
{
    if (addr > 15) {
        std::cout << "WriteFirewirePhy: invalid addr "
                  << static_cast<unsigned int>(addr) << std::endl;
        return false;
    }
    // Set bit 12 to indicate write; addr in bits 11-8, data in bits 7-0
    quadlet_t write_data = 0x00001000 | static_cast<quadlet_t>(addr) << 8 | static_cast<quadlet_t>(data);
    return port->WriteQuadlet(BoardId, BoardIO::FW_PHY_REQ, write_data);
}